

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O2

string * __thiscall
HttpTestListener::GetRequestBody_abi_cxx11_(string *__return_storage_ptr__,HttpTestListener *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->request_body_);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpTestListener::GetRequestBody() {
  return this->request_body_;
}